

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O2

int ply_add_list_property(p_ply ply,char *name,e_ply_type length_type,e_ply_type value_type)

{
  size_t sVar1;
  p_ply_property __dest;
  int iVar2;
  
  sVar1 = strlen(name);
  if ((sVar1 < 0x100) && ((value_type | length_type) < PLY_LIST)) {
    __dest = ply_grow_property(ply,ply->element + ply->nelements + -1);
    if (__dest == (p_ply_property)0x0) {
      iVar2 = 0;
    }
    else {
      strcpy(__dest->name,name);
      __dest->type = PLY_LIST;
      __dest->length_type = length_type;
      __dest->value_type = value_type;
      iVar2 = 1;
    }
  }
  else {
    iVar2 = 0;
    ply_ferror(ply,"Invalid arguments");
  }
  return iVar2;
}

Assistant:

int ply_add_list_property(p_ply ply, const char *name,
        e_ply_type length_type, e_ply_type value_type) {
    p_ply_element element = NULL;
    p_ply_property property = NULL;
    assert(ply && ply->fp && ply->io_mode == PLY_WRITE);
    assert(name && strlen(name) < WORDSIZE);
    if (strlen(name) >= WORDSIZE) {
        ply_ferror(ply, "Invalid arguments");
        return 0;
    }
    assert(length_type < PLY_LIST);
    assert(value_type < PLY_LIST);
    if (length_type >= PLY_LIST || value_type >= PLY_LIST) {
        ply_ferror(ply, "Invalid arguments");
        return 0;
    }
    element = &ply->element[ply->nelements-1];
    property = ply_grow_property(ply, element);
    if (!property) return 0;
    strcpy(property->name, name);
    property->type = PLY_LIST;
    property->length_type = length_type;
    property->value_type = value_type;
    return 1;
}